

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O0

void __thiscall APowerSpeed::DoEffect(APowerSpeed *this)

{
  bool bVar1;
  AActor *pAVar2;
  double dVar3;
  DVector3 local_38;
  APlayerSpeedTrail *local_20;
  AActor *speedMo;
  AInventory *item;
  APowerSpeed *this_local;
  
  item = (AInventory *)this;
  APowerup::DoEffect(&this->super_APowerup);
  bVar1 = TObjPtr<AActor>::operator==(&(this->super_APowerup).super_AInventory.Owner,(AActor *)0x0);
  if ((((!bVar1) &&
       (pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner),
       pAVar2->player != (player_t *)0x0)) &&
      (pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner),
      (pAVar2->player->cheats & 0x2000U) == 0)) &&
     (((this->SpeedFlags & 1U) == 0 && ((::level.time & 1U) == 0)))) {
    for (speedMo = &::TObjPtr::operator_cast_to_AInventory_
                              ((TObjPtr *)
                               &(this->super_APowerup).super_AInventory.super_AActor.Inventory)->
                    super_AActor; speedMo != (AActor *)0x0;
        speedMo = &::TObjPtr::operator_cast_to_AInventory_((TObjPtr *)&speedMo->Inventory)->
                   super_AActor) {
      bVar1 = DObject::IsKindOf((DObject *)speedMo,RegistrationInfo.MyClass);
      if ((bVar1) && (((ulong)speedMo[1].__Pos.Y & 1) == 0)) {
        return;
      }
    }
    pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
    dVar3 = TVector3<double>::LengthSquared(&pAVar2->Vel);
    if (144.0 < dVar3) {
      pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
      AActor::Pos(&local_38,pAVar2);
      local_20 = Spawn<APlayerSpeedTrail>(&local_38,NO_REPLACE);
      if (local_20 != (APlayerSpeedTrail *)0x0) {
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        TAngle<double>::operator=(&(local_20->super_AActor).Angles.Yaw,&(pAVar2->Angles).Yaw);
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        (local_20->super_AActor).Translation = pAVar2->Translation;
        (local_20->super_AActor).target.field_0 =
             (this->super_APowerup).super_AInventory.Owner.field_0;
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        (local_20->super_AActor).sprite = pAVar2->sprite;
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        (local_20->super_AActor).frame = pAVar2->frame;
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        (local_20->super_AActor).Floorclip = pAVar2->Floorclip;
        pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner);
        TVector2<double>::operator=(&(local_20->super_AActor).Scale,&pAVar2->Scale);
        pAVar2 = ::TObjPtr::operator_cast_to_AActor_
                           ((TObjPtr *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
        bVar1 = TObjPtr<AActor>::operator==(&(this->super_APowerup).super_AInventory.Owner,pAVar2);
        if ((bVar1) &&
           (pAVar2 = TObjPtr<AActor>::operator->(&(this->super_APowerup).super_AInventory.Owner),
           (pAVar2->player->cheats & 0x20U) == 0)) {
          TFlags<ActorRenderFlag,_unsigned_int>::operator|=
                    (&(local_20->super_AActor).renderflags,RF_INVISIBLE);
        }
      }
    }
  }
  return;
}

Assistant:

void APowerSpeed::DoEffect ()
{
	Super::DoEffect ();
	
	if (Owner == NULL || Owner->player == NULL)
		return;

	if (Owner->player->cheats & CF_PREDICTING)
		return;

	if (SpeedFlags & PSF_NOTRAIL)
		return;

	if (level.time & 1)
		return;

	// Check if another speed item is present to avoid multiple drawing of the speed trail.
	// Only the last PowerSpeed without PSF_NOTRAIL set will actually draw the trail.
	for (AInventory *item = Inventory; item != NULL; item = item->Inventory)
	{
		if (item->IsKindOf(RUNTIME_CLASS(APowerSpeed)) &&
			!(static_cast<APowerSpeed *>(item)->SpeedFlags & PSF_NOTRAIL))
		{
			return;
		}
	}

	if (Owner->Vel.LengthSquared() <= 12*12)
		return;

	AActor *speedMo = Spawn<APlayerSpeedTrail> (Owner->Pos(), NO_REPLACE);
	if (speedMo)
	{
		speedMo->Angles.Yaw = Owner->Angles.Yaw;
		speedMo->Translation = Owner->Translation;
		speedMo->target = Owner;
		speedMo->sprite = Owner->sprite;
		speedMo->frame = Owner->frame;
		speedMo->Floorclip = Owner->Floorclip;

		// [BC] Also get the scale from the owner.
		speedMo->Scale = Owner->Scale;

		if (Owner == players[consoleplayer].camera &&
			!(Owner->player->cheats & CF_CHASECAM))
		{
			speedMo->renderflags |= RF_INVISIBLE;
		}
	}
}